

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> __thiscall
HandleInfo<XrFaceTracker2FB_T_*>::getWithInstanceInfo
          (HandleInfo<XrFaceTracker2FB_T_*> *this,XrFaceTracker2FB_T *handle)

{
  bool bVar1;
  pointer ppVar2;
  GenValidUsageXrInstanceInfo *local_b8;
  GenValidUsageXrInstanceInfo *instance_info;
  GenValidUsageXrHandleInfo *info;
  string local_a0 [32];
  _Node_iterator_base<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_80;
  _Node_iterator_base<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_78;
  iterator entry_returned;
  UniqueLock lock;
  allocator local_49;
  string local_48 [32];
  XrFaceTracker2FB_T *local_28;
  XrFaceTracker2FB_T *handle_local;
  HandleInfo<XrFaceTracker2FB_T_*> *this_local;
  
  local_28 = handle;
  handle_local = (XrFaceTracker2FB_T *)this;
  if (handle == (XrFaceTracker2FB_T *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Null handle passed to HandleInfoBase::getWithInstanceInfo()",&local_49);
    reportInternalError((string *)local_48);
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&entry_returned,
             &(this->super_HandleInfoBase<XrFaceTracker2FB_T_*,_GenValidUsageXrHandleInfo>).
              dispatch_mutex_);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrFaceTracker2FB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrFaceTracker2FB_T_*>,_std::equal_to<XrFaceTracker2FB_T_*>,_std::allocator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::find((unordered_map<XrFaceTracker2FB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrFaceTracker2FB_T_*>,_std::equal_to<XrFaceTracker2FB_T_*>,_std::allocator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
               *)this,&local_28);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<XrFaceTracker2FB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrFaceTracker2FB_T_*>,_std::equal_to<XrFaceTracker2FB_T_*>,_std::allocator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::end((unordered_map<XrFaceTracker2FB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrFaceTracker2FB_T_*>,_std::equal_to<XrFaceTracker2FB_T_*>,_std::allocator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
              *)this);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrFaceTracker2FB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false,_false>
                           *)&local_78);
    instance_info =
         (GenValidUsageXrInstanceInfo *)
         std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
         ::get(&ppVar2->second);
    local_b8 = (GenValidUsageXrInstanceInfo *)instance_info->instance;
    std::pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*>::
    pair<GenValidUsageXrHandleInfo_*&,_GenValidUsageXrInstanceInfo_*&,_true>
              ((pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> *)&this_local,
               (GenValidUsageXrHandleInfo **)&instance_info,&local_b8);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&entry_returned);
    return _this_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,"Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted",
             (allocator *)((long)&info + 7));
  reportInternalError((string *)local_a0);
}

Assistant:

inline std::pair<GenValidUsageXrHandleInfo *, GenValidUsageXrInstanceInfo *> HandleInfo<HandleType>::getWithInstanceInfo(
    HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::getWithInstanceInfo()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(this->dispatch_mutex_);
    auto entry_returned = this->info_map_.find(handle);
    if (entry_returned == this->info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted");
    }
    GenValidUsageXrHandleInfo *info = entry_returned->second.get();
    GenValidUsageXrInstanceInfo *instance_info = info->instance_info;
    return {info, instance_info};
}